

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.hpp
# Opt level: O0

void __thiscall
Diligent::TextureBase<Diligent::EngineVkImplTraits>::TextureBase
          (TextureBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          TexViewObjAllocatorType *TexViewObjAllocator,RenderDeviceImplType *pDevice,
          TextureDesc *Desc,bool bIsDeviceInternal)

{
  bool bVar1;
  Uint32 UVar2;
  BIND_FLAGS BVar3;
  Char *pCVar4;
  RenderDeviceVkImpl *pRVar5;
  char (*in_stack_ffffffffffffff00) [35];
  size_t local_98;
  undefined1 local_90 [8];
  string msg_1;
  Uint64 DeviceQueuesMask;
  string msg;
  value_type_conflict4 local_32;
  undefined1 local_31;
  TextureDesc *pTStack_30;
  bool bIsDeviceInternal_local;
  TextureDesc *Desc_local;
  RenderDeviceImplType *pDevice_local;
  TexViewObjAllocatorType *TexViewObjAllocator_local;
  IReferenceCounters *pRefCounters_local;
  TextureBase<Diligent::EngineVkImplTraits> *this_local;
  
  local_31 = bIsDeviceInternal;
  pTStack_30 = Desc;
  Desc_local = (TextureDesc *)pDevice;
  pDevice_local = (RenderDeviceImplType *)TexViewObjAllocator;
  TexViewObjAllocator_local = (TexViewObjAllocatorType *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>::
  DeviceObjectBase(&this->
                    super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                   ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>)
  .super_ObjectBase<Diligent::ITextureVk>.super_RefCountedObject<Diligent::ITextureVk>.
  super_ITextureVk.super_ITexture.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_0139ea20;
  this->m_pDefaultViews = (void *)0x0;
  this->m_dbgTexViewObjAllocator = (TexViewObjAllocatorType *)pDevice_local;
  (this->m_ViewIndices)._M_elems[3] = '\0';
  (this->m_ViewIndices)._M_elems[4] = '\0';
  (this->m_ViewIndices)._M_elems[5] = '\0';
  (this->m_ViewIndices)._M_elems[6] = '\0';
  (this->m_ViewIndices)._M_elems[0] = '\0';
  (this->m_ViewIndices)._M_elems[1] = '\0';
  (this->m_ViewIndices)._M_elems[2] = '\0';
  (this->m_ViewIndices)._M_elems[3] = '\0';
  this->m_State = RESOURCE_STATE_UNKNOWN;
  std::
  unique_ptr<Diligent::SparseTextureProperties,std::default_delete<Diligent::SparseTextureProperties>>
  ::unique_ptr<std::default_delete<Diligent::SparseTextureProperties>,void>
            ((unique_ptr<Diligent::SparseTextureProperties,std::default_delete<Diligent::SparseTextureProperties>>
              *)&this->m_pSparseProps);
  local_32 = 0xff;
  std::array<unsigned_char,_7UL>::fill(&this->m_ViewIndices,&local_32);
  if ((this->
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      ).m_Desc.MipLevels == 0) {
    bVar1 = TextureDesc::Is1D(&(this->
                               super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                               ).m_Desc);
    if (bVar1) {
      UVar2 = ComputeMipLevelsCount
                        ((this->
                         super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                         ).m_Desc.Width);
      (this->
      super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
      ).m_Desc.MipLevels = UVar2;
    }
    else {
      bVar1 = TextureDesc::Is2D(&(this->
                                 super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                                 ).m_Desc);
      if (bVar1) {
        UVar2 = ComputeMipLevelsCount
                          ((this->
                           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                           ).m_Desc.Width,
                           (this->
                           super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                           ).m_Desc.Height);
        (this->
        super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
        ).m_Desc.MipLevels = UVar2;
      }
      else {
        bVar1 = TextureDesc::Is3D(&(this->
                                   super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                                   ).m_Desc);
        if (bVar1) {
          UVar2 = ComputeMipLevelsCount
                            ((this->
                             super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                             ).m_Desc.Width,
                             (this->
                             super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                             ).m_Desc.Height,
                             (this->
                             super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                             ).m_Desc.field_3.ArraySize);
          (this->
          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
          ).m_Desc.MipLevels = UVar2;
        }
        else {
          FormatString<char[21]>((string *)&DeviceQueuesMask,(char (*) [21])"Unknown texture type");
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"TextureBase",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
                     ,0x80);
          std::__cxx11::string::~string((string *)&DeviceQueuesMask);
        }
      }
    }
  }
  pRVar5 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      );
  msg_1.field_2._8_8_ =
       RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
       ::GetCommandQueueMask
                 (&pRVar5->
                   super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                 );
  if (((this->
       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
       ).m_Desc.ImmediateContextMask & msg_1.field_2._8_8_) == 0) {
    pRVar5 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             ::GetDevice(&this->
                          super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        );
    local_98 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ::GetCommandQueueCount
                         (&pRVar5->
                           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                         );
    FormatString<char[42],std::ios_base&(std::ios_base&),unsigned_long,char[24],unsigned_long,char[35]>
              ((string *)local_90,(Diligent *)"No bits in the immediate context mask (0x",
               (char (*) [42])std::hex,
               (_func_ios_base_ptr_ios_base_ptr *)
               &(this->
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                ).m_Desc.ImmediateContextMask,(unsigned_long *)") correspond to one of ",
               (char (*) [24])&local_98,(unsigned_long *)" available software command queues",
               in_stack_ffffffffffffff00);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"TextureBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TextureBase.hpp"
               ,0x87);
    std::__cxx11::string::~string((string *)local_90);
  }
  (this->
  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>)
  .m_Desc.ImmediateContextMask =
       (this->
       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
       ).m_Desc.ImmediateContextMask & msg_1.field_2._8_8_;
  pRVar5 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      );
  ValidateTextureDesc(&(this->
                       super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                       ).m_Desc,(IRenderDevice *)pRVar5);
  BVar3 = Diligent::operator&((this->
                              super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                              ).m_Desc.BindFlags,BIND_INPUT_ATTACHMENT);
  if (BVar3 != BIND_NONE) {
    Diligent::operator|=
              (&(this->
                super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                ).m_Desc.BindFlags,BIND_SHADER_RESOURCE);
  }
  return;
}

Assistant:

TextureBase(IReferenceCounters*      pRefCounters,
                TexViewObjAllocatorType& TexViewObjAllocator,
                RenderDeviceImplType*    pDevice,
                const TextureDesc&       Desc,
                bool                     bIsDeviceInternal = false) :
        // clang-format off
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
#ifdef DILIGENT_DEBUG
        , m_dbgTexViewObjAllocator{TexViewObjAllocator}
#endif
    // clang-format on
    {
        m_ViewIndices.fill(Uint8{InvalidViewIndex});

        if (this->m_Desc.MipLevels == 0)
        {
            // Compute the number of levels in the full mipmap chain
            if (this->m_Desc.Is1D())
            {
                this->m_Desc.MipLevels = ComputeMipLevelsCount(this->m_Desc.Width);
            }
            else if (this->m_Desc.Is2D())
            {
                this->m_Desc.MipLevels = ComputeMipLevelsCount(this->m_Desc.Width, this->m_Desc.Height);
            }
            else if (this->m_Desc.Is3D())
            {
                this->m_Desc.MipLevels = ComputeMipLevelsCount(this->m_Desc.Width, this->m_Desc.Height, this->m_Desc.Depth);
            }
            else
            {
                UNEXPECTED("Unknown texture type");
            }
        }

        Uint64 DeviceQueuesMask = this->GetDevice()->GetCommandQueueMask();
        DEV_CHECK_ERR((this->m_Desc.ImmediateContextMask & DeviceQueuesMask) != 0,
                      "No bits in the immediate context mask (0x", std::hex, this->m_Desc.ImmediateContextMask,
                      ") correspond to one of ", this->GetDevice()->GetCommandQueueCount(), " available software command queues");
        this->m_Desc.ImmediateContextMask &= DeviceQueuesMask;

        // Validate correctness of texture description
        ValidateTextureDesc(this->m_Desc, this->GetDevice());

        if ((this->m_Desc.BindFlags & BIND_INPUT_ATTACHMENT) != 0)
            this->m_Desc.BindFlags |= BIND_SHADER_RESOURCE;
    }